

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O0

int __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::init
          (SparseTextureClampLookupColorTestCase *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  vector<int,_std::allocator<int>_> *this_00;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar1;
  value_type_conflict1 local_a0c;
  _Base_ptr local_a08;
  undefined1 local_a00;
  value_type_conflict1 local_9f4;
  _Base_ptr local_9f0;
  undefined1 local_9e8;
  value_type_conflict1 local_9dc;
  _Base_ptr local_9d8;
  undefined1 local_9d0;
  value_type_conflict1 local_9c4;
  _Base_ptr local_9c0;
  undefined1 local_9b8;
  value_type_conflict1 local_9b0;
  allocator<char> local_9a9;
  string local_9a8;
  allocator<char> local_981;
  string local_980;
  FunctionToken local_960;
  _Base_ptr local_8f0;
  undefined1 local_8e8;
  value_type_conflict1 local_8dc;
  _Base_ptr local_8d8;
  undefined1 local_8d0;
  value_type_conflict1 local_8c4;
  _Base_ptr local_8c0;
  undefined1 local_8b8;
  value_type_conflict1 local_8b0;
  allocator<char> local_8a9;
  string local_8a8;
  allocator<char> local_881;
  string local_880;
  FunctionToken local_860;
  _Base_ptr local_7f0;
  undefined1 local_7e8;
  value_type_conflict1 local_7dc;
  _Base_ptr local_7d8;
  undefined1 local_7d0;
  value_type_conflict1 local_7c4;
  _Base_ptr local_7c0;
  undefined1 local_7b8;
  value_type_conflict1 local_7ac;
  _Base_ptr local_7a8;
  undefined1 local_7a0;
  value_type_conflict1 local_794;
  _Base_ptr local_790;
  undefined1 local_788;
  value_type_conflict1 local_77c;
  _Base_ptr local_778;
  undefined1 local_770;
  value_type_conflict1 local_764;
  _Base_ptr local_760;
  undefined1 local_758;
  value_type_conflict1 local_750;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720;
  FunctionToken local_700;
  _Base_ptr local_690;
  undefined1 local_688;
  value_type_conflict1 local_67c;
  _Base_ptr local_678;
  undefined1 local_670;
  value_type_conflict1 local_664;
  _Base_ptr local_660;
  undefined1 local_658;
  value_type_conflict1 local_64c;
  _Base_ptr local_648;
  undefined1 local_640;
  value_type_conflict1 local_634;
  _Base_ptr local_630;
  undefined1 local_628;
  value_type_conflict1 local_620;
  allocator<char> local_619;
  string local_618;
  allocator<char> local_5f1;
  string local_5f0;
  FunctionToken local_5d0;
  _Base_ptr local_560;
  undefined1 local_558;
  value_type_conflict1 local_54c;
  _Base_ptr local_548;
  undefined1 local_540;
  value_type_conflict1 local_534;
  _Base_ptr local_530;
  undefined1 local_528;
  value_type_conflict1 local_51c;
  _Base_ptr local_518;
  undefined1 local_510;
  value_type_conflict1 local_504;
  _Base_ptr local_500;
  undefined1 local_4f8;
  value_type_conflict1 local_4f0;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  FunctionToken local_4a0;
  _Base_ptr local_430;
  undefined1 local_428;
  value_type_conflict1 local_41c;
  _Base_ptr local_418;
  undefined1 local_410;
  value_type_conflict1 local_404;
  _Base_ptr local_400;
  undefined1 local_3f8;
  value_type_conflict1 local_3f0;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  FunctionToken local_3a0;
  _Base_ptr local_330;
  undefined1 local_328;
  value_type_conflict1 local_31c;
  _Base_ptr local_318;
  undefined1 local_310;
  value_type_conflict1 local_304;
  _Base_ptr local_300;
  undefined1 local_2f8;
  value_type_conflict1 local_2ec;
  _Base_ptr local_2e8;
  undefined1 local_2e0;
  value_type_conflict1 local_2d4;
  _Base_ptr local_2d0;
  undefined1 local_2c8;
  value_type_conflict1 local_2bc;
  _Base_ptr local_2b8;
  undefined1 local_2b0;
  value_type_conflict1 local_2a4;
  _Base_ptr local_2a0;
  undefined1 local_298;
  value_type_conflict1 local_290;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  FunctionToken local_240;
  _Base_ptr local_1d0;
  undefined1 local_1c8;
  value_type_conflict1 local_1bc;
  _Base_ptr local_1b8;
  undefined1 local_1b0;
  value_type_conflict1 local_1a4;
  _Base_ptr local_1a0;
  undefined1 local_198;
  value_type_conflict1 local_18c;
  _Base_ptr local_188;
  undefined1 local_180;
  value_type_conflict1 local_174;
  _Base_ptr local_170;
  undefined1 local_168;
  value_type_conflict1 local_160;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_121;
  string local_120;
  FunctionToken local_100;
  undefined1 local_90 [8];
  FunctionToken f;
  value_type_conflict1 local_18;
  value_type_conflict1 local_14;
  SparseTextureClampLookupColorTestCase *local_10;
  SparseTextureClampLookupColorTestCase *this_local;
  
  local_10 = this;
  SparseTextureCommitmentTestCase::init((SparseTextureCommitmentTestCase *)this,ctx);
  this_00 = &(this->super_SparseTextureClampLookupResidencyTestCase).
             super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
             super_SparseTextureCommitmentTestCase.mSupportedTargets;
  local_14 = 0xde0;
  std::vector<int,_std::allocator<int>_>::push_back(this_00,&stack0xffffffffffffffec);
  local_18 = 0x8c18;
  std::vector<int,_std::allocator<int>_>::push_back(this_00,&stack0xffffffffffffffe8);
  f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0x81a5;
  std::vector<int,_std::allocator<int>_>::push_back
            (&(this->super_SparseTextureClampLookupResidencyTestCase).
              super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
              super_SparseTextureCommitmentTestCase.mSupportedInternalFormats,
             (value_type_conflict1 *)
             ((long)&f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken((FunctionToken *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"sparseTextureClampARB",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,", <LOD>",&local_159);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_100,&local_120,&local_158);
  SparseTexture2LookupTestCase::FunctionToken::operator=((FunctionToken *)local_90,&local_100);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_100);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  local_160 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_160);
  local_170 = (_Base_ptr)pVar1.first._M_node;
  local_168 = pVar1.second;
  local_174 = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_174);
  local_188 = (_Base_ptr)pVar1.first._M_node;
  local_180 = pVar1.second;
  local_18c = 0x8513;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_18c);
  local_1a0 = (_Base_ptr)pVar1.first._M_node;
  local_198 = pVar1.second;
  local_1a4 = 0x9009;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_1a4);
  local_1b8 = (_Base_ptr)pVar1.first._M_node;
  local_1b0 = pVar1.second;
  local_1bc = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_1bc);
  local_1d0 = (_Base_ptr)pVar1.first._M_node;
  local_1c8 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&(this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.mFunctions,(value_type *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"textureClampARB",&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,", <LOD>",&local_289);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_240,&local_260,&local_288);
  SparseTexture2LookupTestCase::FunctionToken::operator=((FunctionToken *)local_90,&local_240);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_240);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  local_290 = 0xde0;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_290);
  local_2a0 = (_Base_ptr)pVar1.first._M_node;
  local_298 = pVar1.second;
  local_2a4 = 0x8c18;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_2a4);
  local_2b8 = (_Base_ptr)pVar1.first._M_node;
  local_2b0 = pVar1.second;
  local_2bc = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_2bc);
  local_2d0 = (_Base_ptr)pVar1.first._M_node;
  local_2c8 = pVar1.second;
  local_2d4 = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_2d4);
  local_2e8 = (_Base_ptr)pVar1.first._M_node;
  local_2e0 = pVar1.second;
  local_2ec = 0x8513;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_2ec);
  local_300 = (_Base_ptr)pVar1.first._M_node;
  local_2f8 = pVar1.second;
  local_304 = 0x9009;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_304);
  local_318 = (_Base_ptr)pVar1.first._M_node;
  local_310 = pVar1.second;
  local_31c = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_31c);
  local_330 = (_Base_ptr)pVar1.first._M_node;
  local_328 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&(this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.mFunctions,(value_type *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"sparseTextureOffsetClampARB",&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,", <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>",&local_3e9);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_3a0,&local_3c0,&local_3e8);
  SparseTexture2LookupTestCase::FunctionToken::operator=((FunctionToken *)local_90,&local_3a0);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_3a0);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  local_3f0 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_3f0);
  local_400 = (_Base_ptr)pVar1.first._M_node;
  local_3f8 = pVar1.second;
  local_404 = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_404);
  local_418 = (_Base_ptr)pVar1.first._M_node;
  local_410 = pVar1.second;
  local_41c = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_41c);
  local_430 = (_Base_ptr)pVar1.first._M_node;
  local_428 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&(this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.mFunctions,(value_type *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c0,"textureOffsetClampARB",&local_4c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e8,", <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>",&local_4e9);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_4a0,&local_4c0,&local_4e8);
  SparseTexture2LookupTestCase::FunctionToken::operator=((FunctionToken *)local_90,&local_4a0);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_4a0);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  local_4f0 = 0xde0;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_4f0);
  local_500 = (_Base_ptr)pVar1.first._M_node;
  local_4f8 = pVar1.second;
  local_504 = 0x8c18;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_504);
  local_518 = (_Base_ptr)pVar1.first._M_node;
  local_510 = pVar1.second;
  local_51c = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_51c);
  local_530 = (_Base_ptr)pVar1.first._M_node;
  local_528 = pVar1.second;
  local_534 = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_534);
  local_548 = (_Base_ptr)pVar1.first._M_node;
  local_540 = pVar1.second;
  local_54c = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_54c);
  local_560 = (_Base_ptr)pVar1.first._M_node;
  local_558 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&(this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.mFunctions,(value_type *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"sparseTextureGradClampARB",&local_5f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_618,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <LOD>",&local_619);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_5d0,&local_5f0,&local_618);
  SparseTexture2LookupTestCase::FunctionToken::operator=((FunctionToken *)local_90,&local_5d0);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_5d0);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator(&local_619);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  local_620 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_620);
  local_630 = (_Base_ptr)pVar1.first._M_node;
  local_628 = pVar1.second;
  local_634 = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_634);
  local_648 = (_Base_ptr)pVar1.first._M_node;
  local_640 = pVar1.second;
  local_64c = 0x8513;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_64c);
  local_660 = (_Base_ptr)pVar1.first._M_node;
  local_658 = pVar1.second;
  local_664 = 0x9009;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_664);
  local_678 = (_Base_ptr)pVar1.first._M_node;
  local_670 = pVar1.second;
  local_67c = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_67c);
  local_690 = (_Base_ptr)pVar1.first._M_node;
  local_688 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&(this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.mFunctions,(value_type *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"textureGradClampARB",&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <LOD>",&local_749);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_700,&local_720,&local_748);
  SparseTexture2LookupTestCase::FunctionToken::operator=((FunctionToken *)local_90,&local_700);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_700);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator(&local_749);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  local_750 = 0xde0;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_750);
  local_760 = (_Base_ptr)pVar1.first._M_node;
  local_758 = pVar1.second;
  local_764 = 0x8c18;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_764);
  local_778 = (_Base_ptr)pVar1.first._M_node;
  local_770 = pVar1.second;
  local_77c = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_77c);
  local_790 = (_Base_ptr)pVar1.first._M_node;
  local_788 = pVar1.second;
  local_794 = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_794);
  local_7a8 = (_Base_ptr)pVar1.first._M_node;
  local_7a0 = pVar1.second;
  local_7ac = 0x8513;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_7ac);
  local_7c0 = (_Base_ptr)pVar1.first._M_node;
  local_7b8 = pVar1.second;
  local_7c4 = 0x9009;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_7c4);
  local_7d8 = (_Base_ptr)pVar1.first._M_node;
  local_7d0 = pVar1.second;
  local_7dc = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_7dc);
  local_7f0 = (_Base_ptr)pVar1.first._M_node;
  local_7e8 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&(this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.mFunctions,(value_type *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_880,"sparseTextureGradOffsetClampARB",&local_881);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a8,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>"
             ,&local_8a9);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_860,&local_880,&local_8a8);
  SparseTexture2LookupTestCase::FunctionToken::operator=((FunctionToken *)local_90,&local_860);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_860);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::allocator<char>::~allocator(&local_8a9);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator(&local_881);
  local_8b0 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_8b0);
  local_8c0 = (_Base_ptr)pVar1.first._M_node;
  local_8b8 = pVar1.second;
  local_8c4 = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_8c4);
  local_8d8 = (_Base_ptr)pVar1.first._M_node;
  local_8d0 = pVar1.second;
  local_8dc = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_8dc);
  local_8f0 = (_Base_ptr)pVar1.first._M_node;
  local_8e8 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&(this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.mFunctions,(value_type *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_980,"textureGradOffsetClampARB",&local_981);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a8,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>"
             ,&local_9a9);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_960,&local_980,&local_9a8);
  SparseTexture2LookupTestCase::FunctionToken::operator=((FunctionToken *)local_90,&local_960);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_960);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::allocator<char>::~allocator(&local_9a9);
  std::__cxx11::string::~string((string *)&local_980);
  std::allocator<char>::~allocator(&local_981);
  local_9b0 = 0xde0;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_9b0);
  local_9c0 = (_Base_ptr)pVar1.first._M_node;
  local_9b8 = pVar1.second;
  local_9c4 = 0x8c18;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_9c4);
  local_9d8 = (_Base_ptr)pVar1.first._M_node;
  local_9d0 = pVar1.second;
  local_9dc = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_9dc);
  local_9f0 = (_Base_ptr)pVar1.first._M_node;
  local_9e8 = pVar1.second;
  local_9f4 = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_9f4);
  local_a08 = (_Base_ptr)pVar1.first._M_node;
  local_a00 = pVar1.second;
  local_a0c = 0x806f;
  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
            ((set<int,_std::less<int>,_std::allocator<int>_> *)((long)&f.arguments.field_2 + 8),
             &local_a0c);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&(this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.mFunctions,(value_type *)local_90);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken((FunctionToken *)local_90);
  return extraout_EAX;
}

Assistant:

void SparseTextureClampLookupColorTestCase::init()
{
	SparseTextureCommitmentTestCase::init();
	mSupportedTargets.push_back(GL_TEXTURE_1D);
	mSupportedTargets.push_back(GL_TEXTURE_1D_ARRAY);
	mSupportedInternalFormats.push_back(GL_DEPTH_COMPONENT16);

	FunctionToken f;
	f = FunctionToken("sparseTextureClampARB", ", <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("textureClampARB", ", <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_1D);
	f.allowedTargets.insert(GL_TEXTURE_1D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureOffsetClampARB", ", <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("textureOffsetClampARB", ", <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_1D);
	f.allowedTargets.insert(GL_TEXTURE_1D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGradClampARB",
					  ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("textureGradClampARB", ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_1D);
	f.allowedTargets.insert(GL_TEXTURE_1D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken(
		"sparseTextureGradOffsetClampARB",
		", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken(
		"textureGradOffsetClampARB",
		", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_1D);
	f.allowedTargets.insert(GL_TEXTURE_1D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);
}